

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O3

mainchan *
mainchan_new(PacketProtocolLayer *ppl,ConnectionLayer *cl,Conf *conf,int term_width,int term_height,
            _Bool is_simple,SshChannel **sc_out)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  mainchan *pmVar4;
  Conf *conf_00;
  char *pcVar5;
  SshChannel *pSVar6;
  
  _Var2 = conf_get_bool(conf,0x32);
  if (_Var2) {
    pmVar4 = (mainchan *)0x0;
  }
  else {
    pmVar4 = (mainchan *)safemalloc(1,0x58,0);
    pmVar4->ppl = (PacketProtocolLayer *)0x0;
    pmVar4->cl = (ConnectionLayer *)0x0;
    pmVar4->sc = (SshChannel *)0x0;
    pmVar4->conf = (Conf *)0x0;
    pmVar4->type = MAINCHAN_SESSION;
    pmVar4->is_simple = false;
    pmVar4->req_x11 = false;
    pmVar4->req_agent = false;
    pmVar4->req_pty = false;
    pmVar4->req_cmd_primary = false;
    pmVar4->req_cmd_fallback = false;
    *(undefined2 *)&pmVar4->field_0x2a = 0;
    pmVar4->n_req_env = 0;
    pmVar4->n_env_replies = 0;
    pmVar4->n_env_fails = 0;
    pmVar4->eof_pending = false;
    pmVar4->eof_sent = false;
    pmVar4->got_pty = false;
    pmVar4->ready = false;
    pmVar4->term_width = 0;
    *(undefined8 *)&pmVar4->term_height = 0;
    (pmVar4->chan).vt = (ChannelVtable *)0x0;
    *(undefined8 *)&(pmVar4->chan).initial_fixed_window_size = 0;
    pmVar4->ppl = ppl;
    pmVar4->cl = cl;
    conf_00 = conf_copy(conf);
    pmVar4->conf = conf_00;
    pmVar4->term_width = term_width;
    pmVar4->term_height = term_height;
    pmVar4->is_simple = is_simple;
    pmVar4->sc = (SshChannel *)0x0;
    (pmVar4->chan).vt = &mainchan_channelvt;
    (pmVar4->chan).initial_fixed_window_size = 0;
    pcVar5 = conf_get_str(conf_00,0x33);
    cVar1 = *pcVar5;
    if (cVar1 == '\0') {
      pSVar6 = (*cl->vt->session_open)(cl,&pmVar4->chan);
    }
    else {
      pcVar5 = conf_get_str(pmVar4->conf,0x33);
      iVar3 = conf_get_int(pmVar4->conf,0x34);
      pSVar6 = (*cl->vt->lportfwd_open)
                         (cl,pcVar5,iVar3,"main channel",(SocketPeerInfo *)0x0,&pmVar4->chan);
    }
    pmVar4->sc = pSVar6;
    pmVar4->type = (uint)(cVar1 != '\0');
    if (sc_out != (SshChannel **)0x0) {
      *sc_out = pSVar6;
    }
  }
  return pmVar4;
}

Assistant:

mainchan *mainchan_new(
    PacketProtocolLayer *ppl, ConnectionLayer *cl, Conf *conf,
    int term_width, int term_height, bool is_simple, SshChannel **sc_out)
{
    mainchan *mc;

    if (conf_get_bool(conf, CONF_ssh_no_shell))
        return NULL;                   /* no main channel at all */

    mc = snew(mainchan);
    memset(mc, 0, sizeof(mainchan));
    mc->ppl = ppl;
    mc->cl = cl;
    mc->conf = conf_copy(conf);
    mc->term_width = term_width;
    mc->term_height = term_height;
    mc->is_simple = is_simple;

    mc->sc = NULL;
    mc->chan.vt = &mainchan_channelvt;
    mc->chan.initial_fixed_window_size = 0;

    if (*conf_get_str(mc->conf, CONF_ssh_nc_host)) {
        const char *host = conf_get_str(mc->conf, CONF_ssh_nc_host);
        int port = conf_get_int(mc->conf, CONF_ssh_nc_port);

        mc->sc = ssh_lportfwd_open(cl, host, port, "main channel",
                                   NULL, &mc->chan);
        mc->type = MAINCHAN_DIRECT_TCPIP;
    } else {
        mc->sc = ssh_session_open(cl, &mc->chan);
        mc->type = MAINCHAN_SESSION;
    }

    if (sc_out) *sc_out = mc->sc;
    return mc;
}